

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_input_auth(Curl_easy *data,_Bool proxy,char *auth)

{
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  bool bVar4;
  CURLcode result_1;
  CURLcode result;
  auth *authp;
  unsigned_long *availp;
  connectdata *conn;
  char *auth_local;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  conn = (connectdata *)auth;
  if (proxy) {
    authp = (auth *)&(data->info).proxyauthavail;
    _result_1 = &(data->state).authproxy;
  }
  else {
    authp = (auth *)&(data->info).httpauthavail;
    _result_1 = &(data->state).authhost;
  }
  while (*(char *)&(conn->cpool_node)._list != '\0') {
    iVar2 = curl_strnequal((char *)conn,"NTLM",4);
    if ((iVar2 == 0) ||
       (iVar2 = is_valid_auth_separator(*(char *)((long)&(conn->cpool_node)._list + 4)), iVar2 == 0)
       ) {
      iVar2 = curl_strnequal((char *)conn,"Digest",6);
      if ((iVar2 == 0) ||
         (iVar2 = is_valid_auth_separator(*(char *)((long)&(conn->cpool_node)._list + 6)),
         iVar2 == 0)) {
        iVar2 = curl_strnequal((char *)conn,"Basic",5);
        if ((iVar2 == 0) ||
           (iVar2 = is_valid_auth_separator(*(char *)((long)&(conn->cpool_node)._list + 5)),
           iVar2 == 0)) {
          iVar2 = curl_strnequal((char *)conn,"Bearer",6);
          if ((iVar2 != 0) &&
             (iVar2 = is_valid_auth_separator(*(char *)((long)&(conn->cpool_node)._list + 6)),
             iVar2 != 0)) {
            authp->want = authp->want | 0x40;
            _result_1->avail = _result_1->avail | 0x40;
            if (_result_1->picked == 0x40) {
              _result_1->avail = 0;
              if (((data != (Curl_easy *)0x0) &&
                  ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
                 (((data->state).feat == (curl_trc_feat *)0x0 ||
                  (0 < ((data->state).feat)->log_level)))) {
                Curl_infof(data,"Authentication problem. Ignoring this.");
              }
              *(uint *)&(data->state).field_0x774 =
                   *(uint *)&(data->state).field_0x774 & 0xffffffdf | 0x20;
            }
          }
        }
        else {
          authp->want = authp->want | 1;
          _result_1->avail = _result_1->avail | 1;
          if (_result_1->picked == 1) {
            _result_1->avail = 0;
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              Curl_infof(data,"Authentication problem. Ignoring this.");
            }
            *(uint *)&(data->state).field_0x774 =
                 *(uint *)&(data->state).field_0x774 & 0xffffffdf | 0x20;
          }
        }
      }
      else if ((_result_1->avail & 2) == 0) {
        _Var1 = Curl_auth_is_digest_supported();
        if (_Var1) {
          authp->want = authp->want | 2;
          _result_1->avail = _result_1->avail | 2;
          CVar3 = Curl_input_digest(data,proxy,(char *)conn);
          if (CVar3 != CURLE_OK) {
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              Curl_infof(data,"Authentication problem. Ignoring this.");
            }
            *(uint *)&(data->state).field_0x774 =
                 *(uint *)&(data->state).field_0x774 & 0xffffffdf | 0x20;
          }
        }
      }
      else if (((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
        Curl_infof(data,"Ignoring duplicate digest auth header.");
      }
    }
    else if (((_result_1->avail & 8) != 0) || (_Var1 = Curl_auth_is_ntlm_supported(), _Var1)) {
      authp->want = authp->want | 8;
      _result_1->avail = _result_1->avail | 8;
      if (_result_1->picked == 8) {
        CVar3 = Curl_input_ntlm(data,proxy,(char *)conn);
        if (CVar3 == CURLE_OK) {
          *(uint *)&(data->state).field_0x774 = *(uint *)&(data->state).field_0x774 & 0xffffffdf;
        }
        else {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) {
            Curl_infof(data,"Authentication problem. Ignoring this.");
          }
          *(uint *)&(data->state).field_0x774 =
               *(uint *)&(data->state).field_0x774 & 0xffffffdf | 0x20;
        }
      }
    }
    while( true ) {
      bVar4 = false;
      if (*(char *)&(conn->cpool_node)._list != '\0') {
        bVar4 = *(char *)&(conn->cpool_node)._list != ',';
      }
      if (!bVar4) break;
      conn = (connectdata *)((long)&(conn->cpool_node)._list + 1);
    }
    if (*(char *)&(conn->cpool_node)._list == ',') {
      conn = (connectdata *)((long)&(conn->cpool_node)._list + 1);
    }
    while( true ) {
      bVar4 = false;
      if ((((*(char *)&(conn->cpool_node)._list != '\0') &&
           (bVar4 = true, *(char *)&(conn->cpool_node)._list != ' ')) &&
          (bVar4 = true, *(char *)&(conn->cpool_node)._list != '\t')) &&
         (bVar4 = false, '\t' < *(char *)&(conn->cpool_node)._list)) {
        bVar4 = *(char *)&(conn->cpool_node)._list < '\x0e';
      }
      if (!bVar4) break;
      conn = (connectdata *)((long)&(conn->cpool_node)._list + 1);
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_input_auth(struct Curl_easy *data, bool proxy,
                              const char *auth) /* the first non-space */
{
  /*
   * This resource requires authentication
   */
  struct connectdata *conn = data->conn;
#ifdef USE_SPNEGO
  curlnegotiate *negstate = proxy ? &conn->proxy_negotiate_state :
                                    &conn->http_negotiate_state;
#endif
#if defined(USE_SPNEGO) || \
  defined(USE_NTLM) || \
  !defined(CURL_DISABLE_DIGEST_AUTH) || \
  !defined(CURL_DISABLE_BASIC_AUTH) || \
  !defined(CURL_DISABLE_BEARER_AUTH)

  unsigned long *availp;
  struct auth *authp;

  if(proxy) {
    availp = &data->info.proxyauthavail;
    authp = &data->state.authproxy;
  }
  else {
    availp = &data->info.httpauthavail;
    authp = &data->state.authhost;
  }
#else
  (void) proxy;
#endif

  (void) conn; /* In case conditionals make it unused. */

  /*
   * Here we check if we want the specific single authentication (using ==) and
   * if we do, we initiate usage of it.
   *
   * If the provided authentication is wanted as one out of several accepted
   * types (using &), we OR this authentication type to the authavail
   * variable.
   *
   * Note:
   *
   * ->picked is first set to the 'want' value (one or more bits) before the
   * request is sent, and then it is again set _after_ all response 401/407
   * headers have been received but then only to a single preferred method
   * (bit).
   */

  while(*auth) {
#ifdef USE_SPNEGO
    if(checkprefix("Negotiate", auth) && is_valid_auth_separator(auth[9])) {
      if((authp->avail & CURLAUTH_NEGOTIATE) ||
         Curl_auth_is_spnego_supported()) {
        *availp |= CURLAUTH_NEGOTIATE;
        authp->avail |= CURLAUTH_NEGOTIATE;

        if(authp->picked == CURLAUTH_NEGOTIATE) {
          CURLcode result = Curl_input_negotiate(data, conn, proxy, auth);
          if(!result) {
            free(data->req.newurl);
            data->req.newurl = strdup(data->state.url);
            if(!data->req.newurl)
              return CURLE_OUT_OF_MEMORY;
            data->state.authproblem = FALSE;
            /* we received a GSS auth token and we dealt with it fine */
            *negstate = GSS_AUTHRECV;
          }
          else
            data->state.authproblem = TRUE;
        }
      }
    }
    else
#endif
#ifdef USE_NTLM
      /* NTLM support requires the SSL crypto libs */
      if(checkprefix("NTLM", auth) && is_valid_auth_separator(auth[4])) {
        if((authp->avail & CURLAUTH_NTLM) ||
           Curl_auth_is_ntlm_supported()) {
          *availp |= CURLAUTH_NTLM;
          authp->avail |= CURLAUTH_NTLM;

          if(authp->picked == CURLAUTH_NTLM) {
            /* NTLM authentication is picked and activated */
            CURLcode result = Curl_input_ntlm(data, proxy, auth);
            if(!result) {
              data->state.authproblem = FALSE;
            }
            else {
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
        }
      }
      else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
        if(checkprefix("Digest", auth) && is_valid_auth_separator(auth[6])) {
          if((authp->avail & CURLAUTH_DIGEST) != 0)
            infof(data, "Ignoring duplicate digest auth header.");
          else if(Curl_auth_is_digest_supported()) {
            CURLcode result;

            *availp |= CURLAUTH_DIGEST;
            authp->avail |= CURLAUTH_DIGEST;

            /* We call this function on input Digest headers even if Digest
             * authentication is not activated yet, as we need to store the
             * incoming data from this header in case we are going to use
             * Digest */
            result = Curl_input_digest(data, proxy, auth);
            if(result) {
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
        }
        else
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
          if(checkprefix("Basic", auth) &&
             is_valid_auth_separator(auth[5])) {
            *availp |= CURLAUTH_BASIC;
            authp->avail |= CURLAUTH_BASIC;
            if(authp->picked == CURLAUTH_BASIC) {
              /* We asked for Basic authentication but got a 40X back
                 anyway, which basically means our name+password is not
                 valid. */
              authp->avail = CURLAUTH_NONE;
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
          else
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
            if(checkprefix("Bearer", auth) &&
               is_valid_auth_separator(auth[6])) {
              *availp |= CURLAUTH_BEARER;
              authp->avail |= CURLAUTH_BEARER;
              if(authp->picked == CURLAUTH_BEARER) {
                /* We asked for Bearer authentication but got a 40X back
                  anyway, which basically means our token is not valid. */
                authp->avail = CURLAUTH_NONE;
                infof(data, "Authentication problem. Ignoring this.");
                data->state.authproblem = TRUE;
              }
            }
#else
            {
              /*
               * Empty block to terminate the if-else chain correctly.
               *
               * A semicolon would yield the same result here, but can cause a
               * compiler warning when -Wextra is enabled.
               */
            }
#endif

    /* there may be multiple methods on one line, so keep reading */
    while(*auth && *auth != ',') /* read up to the next comma */
      auth++;
    if(*auth == ',') /* if we are on a comma, skip it */
      auth++;
    while(*auth && ISSPACE(*auth))
      auth++;
  }

  return CURLE_OK;
}